

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall Assimp::SMDImporter::CreateOutputMeshes(SMDImporter *this)

{
  float fVar1;
  aiString *this_00;
  pointer ppVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *pvVar10;
  bool bVar11;
  uint uVar12;
  size_type sVar13;
  ulong uVar14;
  aiMesh **ppaVar15;
  ulong uVar16;
  ulong *puVar17;
  reference pFVar18;
  aiMesh *this_01;
  size_type *psVar19;
  ulong *puVar20;
  pair<unsigned_int,_float> pVar21;
  void *pvVar22;
  reference pvVar23;
  Logger *pLVar24;
  reference pvVar25;
  aiBone *this_02;
  long *plVar26;
  aiVertexWeight *paVar27;
  reference pvVar28;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *this_03;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_04;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar29;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *pvVar30;
  ulong uVar31;
  aiVertexWeight *local_2d0;
  pair<unsigned_int,_float> local_250;
  pair<unsigned_int,_float> local_228;
  pair<unsigned_int,_float> local_200;
  pair<unsigned_int,_float> local_1d8;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *local_198;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_140;
  uint local_10c;
  uint iWeight;
  aiBone **bone;
  uint local_f8;
  uint iBone_4;
  uint iBone_3;
  reference local_e8;
  TempWeightListEntry *pairval_1;
  uint iBone_2;
  reference local_d0;
  TempWeightListEntry *pairval;
  float local_c0;
  uint iBone_1;
  float fSum;
  uint iVert;
  Face *face;
  uint iSrcFace;
  uint iFace_1;
  aiVector3D *pcUVs;
  aiVector3D *pcVerts;
  aiVector3D *pcNormals;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *pvStack_88;
  uint iBone;
  TempBoneWeightList *aaiBones;
  aiMesh **pcMesh;
  value_type_conflict4 local_70;
  uint i_1;
  __normal_iterator<Assimp::SMD::Face_*,_std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>_>
  local_68;
  __normal_iterator<Assimp::SMD::Face_*,_std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>_>
  local_60;
  __normal_iterator<const_Assimp::SMD::Face_*,_std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>_>
  local_58;
  const_iterator iFace;
  uint i;
  uint iNum;
  FaceList *aaiFaces;
  value_type local_30;
  SMDImporter *local_10;
  SMDImporter *this_local;
  
  local_10 = this;
  bVar11 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::empty(&this->aszTextures);
  if (bVar11) {
    std::__cxx11::string::string((string *)&local_30);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->aszTextures,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  sVar13 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size(&this->aszTextures);
  this->pScene->mNumMeshes = (uint)sVar13;
  auVar9 = ZEXT416(this->pScene->mNumMeshes) * ZEXT816(8);
  uVar14 = auVar9._0_8_;
  if (auVar9._8_8_ != 0) {
    uVar14 = 0xffffffffffffffff;
  }
  ppaVar15 = (aiMesh **)operator_new__(uVar14);
  this->pScene->mMeshes = ppaVar15;
  uVar14 = CONCAT44(0,this->pScene->mNumMeshes);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar14;
  uVar16 = SUB168(auVar9 * ZEXT816(0x18),0);
  uVar31 = uVar16 + 8;
  if (SUB168(auVar9 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar16) {
    uVar31 = 0xffffffffffffffff;
  }
  puVar17 = (ulong *)operator_new__(uVar31);
  *puVar17 = uVar14;
  pvVar29 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(puVar17 + 1);
  if (uVar14 != 0) {
    local_140 = pvVar29;
    do {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(local_140);
      local_140 = local_140 + 1;
    } while (local_140 != pvVar29 + uVar14);
  }
  sVar13 = std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::size
                     (&this->asTriangles);
  uVar12 = (uint)((sVar13 & 0xffffffff) / (ulong)this->pScene->mNumMeshes);
  iFace._M_current._4_4_ = (uVar12 >> 1) + uVar12;
  for (iFace._M_current._0_4_ = 0; (uint)iFace._M_current < this->pScene->mNumMeshes;
      iFace._M_current._0_4_ = (uint)iFace._M_current + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (pvVar29 + (uint)iFace._M_current,(ulong)iFace._M_current._4_4_);
  }
  iFace._M_current._4_4_ = 0;
  local_60._M_current =
       (Face *)std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::begin
                         (&this->asTriangles);
  __gnu_cxx::
  __normal_iterator<Assimp::SMD::Face_const*,std::vector<Assimp::SMD::Face,std::allocator<Assimp::SMD::Face>>>
  ::__normal_iterator<Assimp::SMD::Face*>
            ((__normal_iterator<Assimp::SMD::Face_const*,std::vector<Assimp::SMD::Face,std::allocator<Assimp::SMD::Face>>>
              *)&local_58,&local_60);
  while( true ) {
    local_68._M_current =
         (Face *)std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::end
                           (&this->asTriangles);
    bVar11 = __gnu_cxx::operator!=(&local_58,&local_68);
    if (!bVar11) break;
    pFVar18 = __gnu_cxx::
              __normal_iterator<const_Assimp::SMD::Face_*,_std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>_>
              ::operator*(&local_58);
    if (pFVar18->iTexture == 0xffffffff) {
      pFVar18 = __gnu_cxx::
                __normal_iterator<const_Assimp::SMD::Face_*,_std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>_>
                ::operator*(&local_58);
      i_1 = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (pvVar29 + pFVar18->iTexture,&i_1);
    }
    else {
      pFVar18 = __gnu_cxx::
                __normal_iterator<const_Assimp::SMD::Face_*,_std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>_>
                ::operator*(&local_58);
      uVar12 = pFVar18->iTexture;
      sVar13 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&this->aszTextures);
      if (uVar12 < sVar13) {
        pFVar18 = __gnu_cxx::
                  __normal_iterator<const_Assimp::SMD::Face_*,_std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>_>
                  ::operator*(&local_58);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (pvVar29 + pFVar18->iTexture,(value_type_conflict4 *)((long)&iFace._M_current + 4)
                  );
      }
      else {
        pLVar24 = DefaultLogger::get();
        Logger::info(pLVar24,"[SMD/VTA] Material index overflow in face");
        pFVar18 = __gnu_cxx::
                  __normal_iterator<const_Assimp::SMD::Face_*,_std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>_>
                  ::operator*(&local_58);
        uVar12 = pFVar18->iTexture;
        sVar13 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&this->aszTextures);
        local_70 = (int)sVar13 - 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (pvVar29 + uVar12,&local_70);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::SMD::Face_*,_std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>_>
    ::operator++(&local_58);
    iFace._M_current._4_4_ = iFace._M_current._4_4_ + 1;
  }
  pcMesh._4_4_ = 0;
  while( true ) {
    if (this->pScene->mNumMeshes <= pcMesh._4_4_) {
      if (pvVar29 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        uVar14 = *puVar17;
        this_04 = pvVar29 + uVar14;
        while (pvVar29 != this_04) {
          this_04 = this_04 + -1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_04);
        }
        operator_delete__(puVar17,uVar14 * 0x18 + 8);
      }
      return;
    }
    this_01 = (aiMesh *)operator_new(0x520);
    aiMesh::aiMesh(this_01);
    ppaVar15 = this->pScene->mMeshes;
    aaiBones = (TempBoneWeightList *)(ppaVar15 + pcMesh._4_4_);
    ppaVar15[pcMesh._4_4_] = this_01;
    bVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(pvVar29 + pcMesh._4_4_)
    ;
    if (((bVar11 ^ 0xffU) & 1) == 0) break;
    ((aaiBones->
     super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
     )._M_impl.super__Vector_impl_data._M_start)->first = 4;
    sVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar29 + pcMesh._4_4_);
    ((aaiBones->
     super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
     )._M_impl.super__Vector_impl_data._M_start)->second = (float)((int)sVar13 * 3);
    sVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar29 + pcMesh._4_4_);
    (aaiBones->
    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
    )._M_impl.super__Vector_impl_data._M_start[1].first = (uint)sVar13;
    (aaiBones->
    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
    )._M_impl.super__Vector_impl_data._M_start[0x1d].first = pcMesh._4_4_;
    sVar13 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::size
                       (&this->asBones);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = sVar13;
    uVar14 = SUB168(auVar3 * ZEXT816(0x18),0);
    uVar16 = uVar14 + 8;
    if (SUB168(auVar3 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar14) {
      uVar16 = 0xffffffffffffffff;
    }
    psVar19 = (size_type *)operator_new__(uVar16);
    *psVar19 = sVar13;
    pvVar30 = (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               *)(psVar19 + 1);
    if (sVar13 != 0) {
      local_198 = pvVar30;
      do {
        memset(local_198,0,0x18);
        std::
        vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
        vector(local_198);
        local_198 = local_198 + 1;
      } while (local_198 != pvVar30 + sVar13);
    }
    pvStack_88 = pvVar30;
    for (pcNormals._4_4_ = 0; uVar14 = (ulong)pcNormals._4_4_,
        sVar13 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::size
                           (&this->asBones), uVar14 < sVar13; pcNormals._4_4_ = pcNormals._4_4_ + 1)
    {
      pvVar30 = pvStack_88 + pcNormals._4_4_;
      fVar1 = ((aaiBones->
               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->second;
      sVar13 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::size
                         (&this->asBones);
      std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      ::reserve(pvVar30,(uint)fVar1 / sVar13);
    }
    uVar14 = CONCAT44(0,(aaiBones->
                        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[1].first);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar14;
    uVar16 = SUB168(auVar4 * ZEXT816(0x10),0);
    uVar31 = uVar16 + 8;
    if (SUB168(auVar4 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar16) {
      uVar31 = 0xffffffffffffffff;
    }
    puVar20 = (ulong *)operator_new__(uVar31);
    *puVar20 = uVar14;
    pVar21 = (pair<unsigned_int,_float>)(puVar20 + 1);
    if (uVar14 != 0) {
      local_1d8 = pVar21;
      do {
        aiFace::aiFace((aiFace *)local_1d8);
        local_1d8 = (pair<unsigned_int,_float>)((long)local_1d8 + 0x10);
      } while (local_1d8 != (pair<unsigned_int,_float>)((long)pVar21 + uVar14 * 0x10));
    }
    (aaiBones->
    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
    )._M_impl.super__Vector_impl_data._M_start[0x1a] = pVar21;
    uVar14 = CONCAT44(0,((aaiBones->
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->second);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar14;
    uVar16 = SUB168(auVar5 * ZEXT816(0xc),0);
    if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
      uVar16 = 0xffffffffffffffff;
    }
    pVar21 = (pair<unsigned_int,_float>)operator_new__(uVar16);
    if (uVar14 != 0) {
      local_200 = pVar21;
      do {
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_200);
        local_200 = (pair<unsigned_int,_float>)((long)local_200 + 0xc);
      } while (local_200 != (pair<unsigned_int,_float>)((long)pVar21 + uVar14 * 0xc));
    }
    (aaiBones->
    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
    )._M_impl.super__Vector_impl_data._M_start[3] = pVar21;
    uVar14 = CONCAT44(0,((aaiBones->
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->second);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar14;
    uVar16 = SUB168(auVar6 * ZEXT816(0xc),0);
    if (SUB168(auVar6 * ZEXT816(0xc),8) != 0) {
      uVar16 = 0xffffffffffffffff;
    }
    pcVerts = (aiVector3D *)pVar21;
    pVar21 = (pair<unsigned_int,_float>)operator_new__(uVar16);
    if (uVar14 != 0) {
      local_228 = pVar21;
      do {
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_228);
        local_228 = (pair<unsigned_int,_float>)((long)local_228 + 0xc);
      } while (local_228 != (pair<unsigned_int,_float>)((long)pVar21 + uVar14 * 0xc));
    }
    (aaiBones->
    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
    )._M_impl.super__Vector_impl_data._M_start[2] = pVar21;
    iSrcFace = 0;
    iFace_1 = 0;
    pcUVs = (aiVector3D *)pVar21;
    if ((this->bHasUVs & 1U) != 0) {
      uVar14 = CONCAT44(0,((aaiBones->
                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->second);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar14;
      uVar16 = SUB168(auVar7 * ZEXT816(0xc),0);
      if (SUB168(auVar7 * ZEXT816(0xc),8) != 0) {
        uVar16 = 0xffffffffffffffff;
      }
      pVar21 = (pair<unsigned_int,_float>)operator_new__(uVar16);
      if (uVar14 != 0) {
        local_250 = pVar21;
        do {
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_250);
          local_250 = (pair<unsigned_int,_float>)((long)local_250 + 0xc);
        } while (local_250 != (pair<unsigned_int,_float>)((long)pVar21 + uVar14 * 0xc));
      }
      (aaiBones->
      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      )._M_impl.super__Vector_impl_data._M_start[0xe] = pVar21;
      (aaiBones->
      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      )._M_impl.super__Vector_impl_data._M_start[0x16].first = 2;
      _iSrcFace = pVar21;
    }
    iFace._M_current._4_4_ = 0;
    for (face._4_4_ = 0;
        face._4_4_ <
        (aaiBones->
        super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        )._M_impl.super__Vector_impl_data._M_start[1].first; face._4_4_ = face._4_4_ + 1) {
      pvVar22 = operator_new__(0xc);
      *(void **)((long)(aaiBones->
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[0x1a] + (ulong)face._4_4_ * 0x10 +
                8) = pvVar22;
      *(undefined4 *)
       ((long)(aaiBones->
              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              )._M_impl.super__Vector_impl_data._M_start[0x1a] + (ulong)face._4_4_ * 0x10) = 3;
      pvVar23 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          (pvVar29 + pcMesh._4_4_,(ulong)face._4_4_);
      face._0_4_ = *pvVar23;
      _fSum = std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::operator[]
                        (&this->asTriangles,(ulong)(uint)face);
      fVar1 = _fSum->avVertices[0].pos.y;
      pcUVs->x = _fSum->avVertices[0].pos.x;
      pcUVs->y = fVar1;
      pcUVs->z = _fSum->avVertices[0].pos.z;
      fVar1 = _fSum->avVertices[1].pos.y;
      pcUVs[1].x = _fSum->avVertices[1].pos.x;
      pcUVs[1].y = fVar1;
      pcUVs[1].z = _fSum->avVertices[1].pos.z;
      fVar1 = _fSum->avVertices[2].pos.y;
      pcUVs[2].x = _fSum->avVertices[2].pos.x;
      pcUVs[2].y = fVar1;
      pcUVs[2].z = _fSum->avVertices[2].pos.z;
      fVar1 = _fSum->avVertices[0].nor.y;
      pcVerts->x = _fSum->avVertices[0].nor.x;
      pcVerts->y = fVar1;
      pcVerts->z = _fSum->avVertices[0].nor.z;
      fVar1 = _fSum->avVertices[1].nor.y;
      pcVerts[1].x = _fSum->avVertices[1].nor.x;
      pcVerts[1].y = fVar1;
      pcVerts[1].z = _fSum->avVertices[1].nor.z;
      fVar1 = _fSum->avVertices[2].nor.y;
      pcVerts[2].x = _fSum->avVertices[2].nor.x;
      pcVerts[2].y = fVar1;
      pcVerts[2].z = _fSum->avVertices[2].nor.z;
      if (_iSrcFace != (pair<unsigned_int,_float>)0x0) {
        *(undefined8 *)_iSrcFace = *(undefined8 *)&_fSum->avVertices[0].uv;
        *(float *)((long)_iSrcFace + 8) = _fSum->avVertices[0].uv.z;
        fVar1 = _fSum->avVertices[1].uv.y;
        ((aiVector3t<float> *)((long)_iSrcFace + 0xc))->x = _fSum->avVertices[1].uv.x;
        ((aiVector3t<float> *)((long)_iSrcFace + 0xc))->y = fVar1;
        ((aiVector3t<float> *)((long)_iSrcFace + 0xc))->z = _fSum->avVertices[1].uv.z;
        fVar1 = _fSum->avVertices[2].uv.y;
        ((aiVector3t<float> *)((long)_iSrcFace + 0x18))->x = _fSum->avVertices[2].uv.x;
        ((aiVector3t<float> *)((long)_iSrcFace + 0x18))->y = fVar1;
        ((aiVector3t<float> *)((long)_iSrcFace + 0x18))->z = _fSum->avVertices[2].uv.z;
        _iSrcFace = (pair<unsigned_int,_float>)((long)_iSrcFace + 0x24);
      }
      pcUVs = pcUVs + 3;
      pcVerts = pcVerts + 3;
      for (iBone_1 = 0; iBone_1 < 3; iBone_1 = iBone_1 + 1) {
        local_c0 = 0.0;
        for (pairval._4_4_ = 0; uVar14 = (ulong)pairval._4_4_,
            sVar13 = std::
                     vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                     ::size(&_fSum->avVertices[iBone_1].aiBoneLinks), uVar14 < sVar13;
            pairval._4_4_ = pairval._4_4_ + 1) {
          local_d0 = std::
                     vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                     ::operator[](&_fSum->avVertices[iBone_1].aiBoneLinks,(ulong)pairval._4_4_);
          uVar12 = local_d0->first;
          sVar13 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::size
                             (&this->asBones);
          if ((uVar12 < sVar13) && (local_d0->first != _fSum->avVertices[iBone_1].iParentNode)) {
            pvVar30 = pvStack_88 + local_d0->first;
            std::pair<unsigned_int,_float>::pair<unsigned_int_&,_float_&,_true>
                      ((pair<unsigned_int,_float> *)&stack0xffffffffffffff28,
                       (uint *)((long)&iFace._M_current + 4),&local_d0->second);
            std::
            vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ::push_back(pvVar30,(value_type *)&stack0xffffffffffffff28);
            local_c0 = local_d0->second + local_c0;
          }
          else {
            pLVar24 = DefaultLogger::get();
            Logger::error(pLVar24,
                          "[SMD/VTA] Bone index overflow. The bone index will be ignored, the weight will be assigned to the vertex\' parent node"
                         );
          }
        }
        if ((local_c0 < 0.975) && (_fSum->avVertices[iBone_1].iParentNode != 0xffffffff)) {
          uVar12 = _fSum->avVertices[iBone_1].iParentNode;
          sVar13 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::size
                             (&this->asBones);
          if (uVar12 < sVar13) {
            pvVar30 = pvStack_88 + _fSum->avVertices[iBone_1].iParentNode;
            iBone_4 = (uint)(1.0 - local_c0);
            std::pair<unsigned_int,_float>::pair<unsigned_int_&,_float,_true>
                      ((pair<unsigned_int,_float> *)&iBone_3,(uint *)((long)&iFace._M_current + 4),
                       (float *)&iBone_4);
            std::
            vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
            ::push_back(pvVar30,(value_type *)&iBone_3);
          }
          else {
            pLVar24 = DefaultLogger::get();
            Logger::error(pLVar24,
                          "[SMD/VTA] Bone index overflow. The index of the vertex parent bone is invalid. The remaining weights will be normalized to 1.0"
                         );
            if ((local_c0 != 0.0) || (NAN(local_c0))) {
              local_c0 = 1.0 / local_c0;
              for (pairval_1._4_4_ = 0; uVar14 = (ulong)pairval_1._4_4_,
                  sVar13 = std::
                           vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           ::size(&_fSum->avVertices[iBone_1].aiBoneLinks), uVar14 < sVar13;
                  pairval_1._4_4_ = pairval_1._4_4_ + 1) {
                local_e8 = std::
                           vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           ::operator[](&_fSum->avVertices[iBone_1].aiBoneLinks,
                                        (ulong)pairval_1._4_4_);
                uVar12 = local_e8->first;
                sVar13 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::size
                                   (&this->asBones);
                fVar1 = local_c0;
                if (uVar12 < sVar13) {
                  pvVar25 = std::
                            vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            ::back(pvStack_88 + local_e8->first);
                  pvVar25->second = fVar1 * pvVar25->second;
                }
              }
            }
          }
        }
        *(uint *)(*(long *)((long)(aaiBones->
                                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start[0x1a] +
                            (ulong)face._4_4_ * 0x10 + 8) + (ulong)iBone_1 * 4) =
             iFace._M_current._4_4_;
        iFace._M_current._4_4_ = iFace._M_current._4_4_ + 1;
      }
    }
    iFace._M_current._4_4_ = 0;
    for (local_f8 = 0;
        sVar13 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::size
                           (&this->asBones), local_f8 < sVar13; local_f8 = local_f8 + 1) {
      bVar11 = std::
               vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               ::empty(pvStack_88 + local_f8);
      if (!bVar11) {
        iFace._M_current._4_4_ = iFace._M_current._4_4_ + 1;
      }
    }
    if (iFace._M_current._4_4_ != 0) {
      (aaiBones->
      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      )._M_impl.super__Vector_impl_data._M_start[0x1b].first = iFace._M_current._4_4_;
      auVar9 = ZEXT416((aaiBones->
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[0x1b].first) * ZEXT816(8);
      uVar14 = auVar9._0_8_;
      if (auVar9._8_8_ != 0) {
        uVar14 = 0xffffffffffffffff;
      }
      pVar21 = (pair<unsigned_int,_float>)operator_new__(uVar14);
      (aaiBones->
      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      )._M_impl.super__Vector_impl_data._M_start[0x1c] = pVar21;
      iFace._M_current._4_4_ = 0;
      for (bone._4_4_ = 0;
          sVar13 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::size
                             (&this->asBones), bone._4_4_ < sVar13; bone._4_4_ = bone._4_4_ + 1) {
        bVar11 = std::
                 vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 ::empty(pvStack_88 + bone._4_4_);
        if (!bVar11) {
          this_02 = (aiBone *)operator_new(0x450);
          aiBone::aiBone(this_02);
          pVar21 = (aaiBones->
                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[0x1c];
          plVar26 = (long *)((long)pVar21 + (ulong)iFace._M_current._4_4_ * 8);
          *(aiBone **)((long)pVar21 + (ulong)iFace._M_current._4_4_ * 8) = this_02;
          sVar13 = std::
                   vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   ::size(pvStack_88 + bone._4_4_);
          *(int *)(*plVar26 + 0x404) = (int)sVar13;
          uVar14 = CONCAT44(0,*(uint *)(*plVar26 + 0x404));
          auVar8._8_8_ = 0;
          auVar8._0_8_ = uVar14;
          uVar16 = SUB168(auVar8 * ZEXT816(8),0);
          if (SUB168(auVar8 * ZEXT816(8),8) != 0) {
            uVar16 = 0xffffffffffffffff;
          }
          paVar27 = (aiVertexWeight *)operator_new__(uVar16);
          if (uVar14 != 0) {
            local_2d0 = paVar27;
            do {
              aiVertexWeight::aiVertexWeight(local_2d0);
              local_2d0 = local_2d0 + 1;
            } while (local_2d0 != paVar27 + uVar14);
          }
          *(aiVertexWeight **)(*plVar26 + 0x408) = paVar27;
          pvVar28 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::operator[]
                              (&this->asBones,(ulong)bone._4_4_);
          memcpy((void *)(*plVar26 + 0x410),&pvVar28->mOffsetMatrix,0x40);
          this_00 = (aiString *)*plVar26;
          pvVar28 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::operator[]
                              (&this->asBones,(ulong)bone._4_4_);
          aiString::Set(this_00,&pvVar28->mName);
          pvVar28 = std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::operator[]
                              (&this->asBones,(ulong)bone._4_4_);
          pvVar28->bIsUsed = true;
          for (local_10c = 0; local_10c < *(uint *)(*plVar26 + 0x404); local_10c = local_10c + 1) {
            pvVar25 = std::
                      vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ::operator[](pvStack_88 + bone._4_4_,(ulong)local_10c);
            *(uint *)(*(long *)(*plVar26 + 0x408) + (ulong)local_10c * 8) = pvVar25->first;
            pvVar25 = std::
                      vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ::operator[](pvStack_88 + bone._4_4_,(ulong)local_10c);
            *(float *)(*(long *)(*plVar26 + 0x408) + 4 + (ulong)local_10c * 8) = pvVar25->second;
          }
          iFace._M_current._4_4_ = iFace._M_current._4_4_ + 1;
        }
      }
    }
    pvVar30 = pvStack_88;
    if (pvStack_88 !=
        (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *)
        0x0) {
      pvVar10 = pvStack_88 + -1;
      ppVar2 = pvStack_88[-1].
               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      this_03 = pvStack_88 + (long)ppVar2;
      while (pvVar30 != this_03) {
        this_03 = this_03 + -1;
        std::
        vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
        ~vector(this_03);
      }
      operator_delete__(&(pvVar10->
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         )._M_impl.super__Vector_impl_data._M_end_of_storage,(long)ppVar2 * 0x18 + 8
                       );
    }
    pcMesh._4_4_ = pcMesh._4_4_ + 1;
  }
  __assert_fail("!aaiFaces[i].empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/SMD/SMDLoader.cpp"
                ,0x10c,"void Assimp::SMDImporter::CreateOutputMeshes()");
}

Assistant:

void SMDImporter::CreateOutputMeshes() {
    if (aszTextures.empty()) {
        aszTextures.push_back(std::string());
    }

    // we need to sort all faces by their material index
    // in opposition to other loaders we can be sure that each
    // material is at least used once.
    pScene->mNumMeshes = (unsigned int) aszTextures.size();
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];

    typedef std::vector<unsigned int> FaceList;
    FaceList* aaiFaces = new FaceList[pScene->mNumMeshes];

    // approximate the space that will be required
    unsigned int iNum = (unsigned int)asTriangles.size() / pScene->mNumMeshes;
    iNum += iNum >> 1;
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
        aaiFaces[i].reserve(iNum);
    }

    // collect all faces
    iNum = 0;
    for (std::vector<SMD::Face>::const_iterator
            iFace =  asTriangles.begin();
            iFace != asTriangles.end();++iFace,++iNum) {
        if (UINT_MAX == (*iFace).iTexture) {
            aaiFaces[(*iFace).iTexture].push_back( 0 );
        } else if ((*iFace).iTexture >= aszTextures.size()) {
            ASSIMP_LOG_INFO("[SMD/VTA] Material index overflow in face");
            aaiFaces[(*iFace).iTexture].push_back((unsigned int)aszTextures.size()-1);
        } else {
            aaiFaces[(*iFace).iTexture].push_back(iNum);
        }
    }

    // now create the output meshes
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i) {
        aiMesh*& pcMesh = pScene->mMeshes[i] = new aiMesh();
        ai_assert(!aaiFaces[i].empty()); // should not be empty ...

        pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
        pcMesh->mNumVertices = (unsigned int)aaiFaces[i].size()*3;
        pcMesh->mNumFaces = (unsigned int)aaiFaces[i].size();
        pcMesh->mMaterialIndex = i;

        // storage for bones
        typedef std::pair<unsigned int,float> TempWeightListEntry;
        typedef std::vector< TempWeightListEntry > TempBoneWeightList;

        TempBoneWeightList* aaiBones = new TempBoneWeightList[asBones.size()]();

        // try to reserve enough memory without wasting too much
        for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
            aaiBones[iBone].reserve(pcMesh->mNumVertices/asBones.size());
        }

        // allocate storage
        pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];
        aiVector3D* pcNormals = pcMesh->mNormals = new aiVector3D[pcMesh->mNumVertices];
        aiVector3D* pcVerts = pcMesh->mVertices = new aiVector3D[pcMesh->mNumVertices];

        aiVector3D* pcUVs = nullptr;
        if (bHasUVs) {
            pcUVs = pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
            pcMesh->mNumUVComponents[0] = 2;
        }

        iNum = 0;
        for (unsigned int iFace = 0; iFace < pcMesh->mNumFaces;++iFace) {
            pcMesh->mFaces[iFace].mIndices = new unsigned int[3];
            pcMesh->mFaces[iFace].mNumIndices = 3;

            // fill the vertices
            unsigned int iSrcFace = aaiFaces[i][iFace];
            SMD::Face& face = asTriangles[iSrcFace];

            *pcVerts++ = face.avVertices[0].pos;
            *pcVerts++ = face.avVertices[1].pos;
            *pcVerts++ = face.avVertices[2].pos;

            // fill the normals
            *pcNormals++ = face.avVertices[0].nor;
            *pcNormals++ = face.avVertices[1].nor;
            *pcNormals++ = face.avVertices[2].nor;

            // fill the texture coordinates
            if (pcUVs) {
                *pcUVs++ = face.avVertices[0].uv;
                *pcUVs++ = face.avVertices[1].uv;
                *pcUVs++ = face.avVertices[2].uv;
            }

            for (unsigned int iVert = 0; iVert < 3;++iVert) {
                float fSum = 0.0f;
                for (unsigned int iBone = 0;iBone < face.avVertices[iVert].aiBoneLinks.size();++iBone)  {
                    TempWeightListEntry& pairval = face.avVertices[iVert].aiBoneLinks[iBone];

                    // FIX: The second check is here just to make sure we won't
                    // assign more than one weight to a single vertex index
                    if (pairval.first >= asBones.size() || pairval.first == face.avVertices[iVert].iParentNode) {
                        ASSIMP_LOG_ERROR("[SMD/VTA] Bone index overflow. "
                            "The bone index will be ignored, the weight will be assigned "
                            "to the vertex' parent node");
                        continue;
                    }
                    aaiBones[pairval.first].push_back(TempWeightListEntry(iNum,pairval.second));
                    fSum += pairval.second;
                }
                // ******************************************************************
                // If the sum of all vertex weights is not 1.0 we must assign
                // the rest to the vertex' parent node. Well, at least the doc says
                // we should ...
                // FIX: We use 0.975 as limit, floating-point inaccuracies seem to
                // be very strong in some SMD exporters. Furthermore it is possible
                // that the parent of a vertex is 0xffffffff (if the corresponding
                // entry in the file was unreadable)
                // ******************************************************************
                if (fSum < 0.975f && face.avVertices[iVert].iParentNode != UINT_MAX) {
                    if (face.avVertices[iVert].iParentNode >= asBones.size()) {
                        ASSIMP_LOG_ERROR("[SMD/VTA] Bone index overflow. "
                            "The index of the vertex parent bone is invalid. "
                            "The remaining weights will be normalized to 1.0");

                        if (fSum) {
                            fSum = 1 / fSum;
                            for (unsigned int iBone = 0;iBone < face.avVertices[iVert].aiBoneLinks.size();++iBone) {
                                TempWeightListEntry& pairval = face.avVertices[iVert].aiBoneLinks[iBone];
                                if (pairval.first >= asBones.size()) {
                                    continue;
                                }
                                aaiBones[pairval.first].back().second *= fSum;
                            }
                        }
                    } else {
                        aaiBones[face.avVertices[iVert].iParentNode].push_back(
                            TempWeightListEntry(iNum,1.0f-fSum));
                    }
                }
                pcMesh->mFaces[iFace].mIndices[iVert] = iNum++;
            }
        }

        // now build all bones of the mesh
        iNum = 0;
        for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
            if (!aaiBones[iBone].empty())++iNum;
        }

        if (iNum) {
            pcMesh->mNumBones = iNum;
            pcMesh->mBones = new aiBone*[pcMesh->mNumBones];
            iNum = 0;
            for (unsigned int iBone = 0; iBone < asBones.size();++iBone) {
                if (aaiBones[iBone].empty()) {
                    continue;
                }
                aiBone*& bone = pcMesh->mBones[iNum] = new aiBone();

                bone->mNumWeights = (unsigned int)aaiBones[iBone].size();
                bone->mWeights = new aiVertexWeight[bone->mNumWeights];
                bone->mOffsetMatrix = asBones[iBone].mOffsetMatrix;
                bone->mName.Set( asBones[iBone].mName );

                asBones[iBone].bIsUsed = true;

                for (unsigned int iWeight = 0; iWeight < bone->mNumWeights;++iWeight) {
                    bone->mWeights[iWeight].mVertexId = aaiBones[iBone][iWeight].first;
                    bone->mWeights[iWeight].mWeight = aaiBones[iBone][iWeight].second;
                }
                ++iNum;
            }
        }
        delete[] aaiBones;
    }
    delete[] aaiFaces;
}